

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p)

{
  set_block_pixels_context *in_RDI;
  set_block_pixels_context context;
  set_block_pixels_context *in_stack_fffffffffffff0e0;
  set_block_pixels_context *in_stack_fffffffffffff2f0;
  pack_params *in_stack_fffffffffffff2f8;
  color_quad_u8 *in_stack_fffffffffffff300;
  uint in_stack_fffffffffffff308;
  uint in_stack_fffffffffffff30c;
  dxt_image *in_stack_fffffffffffff310;
  
  set_block_pixels_context::set_block_pixels_context(in_stack_fffffffffffff0e0);
  set_block_pixels(in_stack_fffffffffffff310,in_stack_fffffffffffff30c,in_stack_fffffffffffff308,
                   in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
  set_block_pixels_context::~set_block_pixels_context(in_RDI);
  return;
}

Assistant:

void dxt_image::set_block_pixels(uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p) {
  set_block_pixels_context context;
  set_block_pixels(block_x, block_y, pPixels, p, context);
}